

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

printer * __thiscall
boost::ext::ut::v1_1_8::printer::operator<<
          (printer *this,eq_<double,_boost::ext::ut::v1_1_8::detail::integral_constant<2>_> *op)

{
  printer *ppVar1;
  string_view local_28;
  
  local_28 = color(this,op->value_);
  ppVar1 = operator<<(this,&local_28);
  std::ostream::_M_insert<double>(op->lhs_);
  std::operator<<((ostream *)&ppVar1->field_0x40," == ");
  std::ostream::operator<<(&ppVar1->field_0x40,2);
  ppVar1 = operator<<(ppVar1,(basic_string_view<char,_std::char_traits<char>_> *)this);
  return ppVar1;
}

Assistant:

auto& operator<<(const detail::eq_<TLhs, TRhs>& op) {
      return (*this << color(op) << op.lhs() << " == " << op.rhs()
                    << colors_.none);
    }